

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest.cpp
# Opt level: O1

void __thiscall TcpSocketTest::Run(TcpSocketTest *this)

{
  int iVar1;
  Selector *this_00;
  uint32_t new_number;
  uint32_t number;
  Address server_addr;
  Socket sock;
  ServerSocket server;
  int local_124;
  int local_120;
  char local_11c [16];
  undefined4 local_10c;
  Address local_f8 [3];
  Address local_88 [3];
  
  this_00 = (Selector *)
            operator_new(0x278,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
                         ,0xcb);
  Selector::Selector(this_00,"TcpSelector");
  this->mSelector = this_00;
  JetHead::Socket::Socket((Socket *)local_f8,true);
  JetHead::ServerSocket::ServerSocket((ServerSocket *)local_88,true);
  local_11c[0] = '\x02';
  local_11c[1] = '\0';
  local_11c[2] = '\0';
  local_11c[3] = '\0';
  local_11c[4] = '\0';
  local_11c[5] = '\0';
  local_11c[6] = '\0';
  local_11c[7] = '\0';
  local_10c = 0x10;
  iVar1 = JetHead::ServerSocket::bind(local_88);
  if (iVar1 < 0) {
    jh_log_print(3,"virtual void TcpSocketTest::Run()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
                 ,0xd4,"Bind Failed");
  }
  iVar1 = JetHead::ServerSocket::listen((int)local_88);
  if (iVar1 < 0) {
    jh_log_print(3,"virtual void TcpSocketTest::Run()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
                 ,0xd9,"Listen Failed");
  }
  iVar1 = JetHead::Socket::getLocalAddress(local_88);
  JetHead::Socket::Address::setAddress(local_11c);
  if (iVar1 < 0) {
    jh_log_print(3,"virtual void TcpSocketTest::Run()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
                 ,0xdf,"get local addr failed");
  }
  JetHead::Socket::setSelector((SocketListener *)local_88,(Selector *)&this->super_SocketListener);
  iVar1 = JetHead::Socket::connect(local_f8);
  local_120 = 1000;
  if (iVar1 < 0) {
    jh_log_print(3,"virtual void TcpSocketTest::Run()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
                 ,0xea,"connect failed");
  }
  iVar1 = JetHead::Socket::write(local_f8,(int)&local_120);
  if (iVar1 < 0) {
    jh_log_print(3,"virtual void TcpSocketTest::Run()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
                 ,0xef,"write failed");
  }
  iVar1 = JetHead::Socket::read(local_f8,(int)&local_124);
  if (local_124 != local_120 + 1) {
    jh_log_print(2,"virtual void TcpSocketTest::Run()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
                 ,0xf4,"FAILED");
  }
  if (iVar1 < 0) {
    jh_log_print(3,"virtual void TcpSocketTest::Run()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
                 ,0xf7,"write failed");
  }
  local_120 = local_124 + 1;
  iVar1 = JetHead::Socket::write(local_f8,(int)&local_120);
  if (iVar1 < 0) {
    jh_log_print(3,"virtual void TcpSocketTest::Run()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
                 ,0xfe,"write failed");
  }
  iVar1 = JetHead::Socket::read(local_f8,(int)&local_124);
  if (local_124 != local_120 + 1) {
    jh_log_print(2,"virtual void TcpSocketTest::Run()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
                 ,0x103,"FAILED");
  }
  if (iVar1 < 0) {
    jh_log_print(3,"virtual void TcpSocketTest::Run()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
                 ,0x106,"write failed");
  }
  this->mTestState = 0;
  JetHead::Socket::close();
  usleep(100000);
  if (this->mTestState != 1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest.cpp"
               ,0x111,"handleClose not recieved on server");
  }
  if (this->mSelector != (Selector *)0x0) {
    (**(code **)(*(long *)this->mSelector + 0x58))();
  }
  TestCase::TestPassed(&this->super_TestCase);
  JetHead::ServerSocket::~ServerSocket((ServerSocket *)local_88);
  JetHead::Socket::~Socket((Socket *)local_f8);
  return;
}

Assistant:

void TcpSocketTest::Run()
{	
	LOG_NOTICE( "TCP Test Started" );

	mSelector = jh_new Selector( "TcpSelector" );

	Socket sock;
	ServerSocket server;
	Socket::Address server_addr, client_addr;
	
	int res = server.bind( server_addr );

	if ( res < 0 )
		LOG_WARN_PERROR( "Bind Failed" );

	res = server.listen( 5 );

	if ( res < 0 )
		LOG_WARN_PERROR( "Listen Failed" );
	
	res = server.getLocalAddress( server_addr );
	server_addr.setAddress( "127.0.0.1" );
	
	if ( res < 0 )
		LOG_WARN_PERROR( "get local addr failed" );
	
	LOG_NOTICE( "Server name %s:%d", server_addr.getName(), server_addr.getPort() );
	
	server.setSelector( this, mSelector );
	res = sock.connect( server_addr );

	uint32_t number = 1000;
	uint32_t new_number;
	
	if ( res < 0 )
		LOG_WARN_PERROR( "connect failed" );
	
	res = sock.write( &number, 4 );

	if ( res < 0 )
		LOG_WARN_PERROR( "write failed" );

	res = sock.read( &new_number, 4 );

	if ( new_number != number + 1 )
		LOG_WARN( "FAILED" );
	
	if ( res < 0 )
		LOG_WARN_PERROR( "write failed" );

	number = new_number + 1;
	
	res = sock.write( &number, 4 );

	if ( res < 0 )
		LOG_WARN_PERROR( "write failed" );

	res = sock.read( &new_number, 4 );

	if ( new_number != number + 1 )
		LOG_WARN( "FAILED" );
	
	if ( res < 0 )
		LOG_WARN_PERROR( "write failed" );
	
	LOG_NOTICE( "Data sent" );
	
	mTestState = 0;
	
	sock.close();
	usleep( 100000 );
	
	if ( mTestState != 1 )
	{
		TestFailed( "handleClose not recieved on server" );
	}
	
	delete mSelector;
	
	TestPassed();
}